

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int reparse_relative_location_path(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  lyxp_token tok;
  
  if (exp->used != *exp_idx) {
    do {
      uVar1 = *exp_idx;
      tok = exp->tokens[uVar1];
      switch(tok) {
      case LYXP_TOKEN_DOT:
      case LYXP_TOKEN_DDOT:
        *exp_idx = uVar1 + 1;
        goto LAB_00179beb;
      case LYXP_TOKEN_AT:
        *exp_idx = uVar1 + 1;
        if (exp->used == (uint16_t)(uVar1 + 1)) goto LAB_00179ba0;
        tok = exp->tokens[*exp_idx];
        if (1 < tok - LYXP_TOKEN_NAMETEST) goto switchD_00179be3_caseD_8;
        break;
      default:
switchD_00179be3_caseD_8:
        pcVar4 = print_token(tok);
        ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,
                exp->expr + exp->expr_pos[*exp_idx]);
        return -1;
      case LYXP_TOKEN_NAMETEST:
        break;
      case LYXP_TOKEN_NODETYPE:
        *exp_idx = uVar1 + 1;
        iVar3 = exp_check_token(ctx,exp,uVar1 + 1,LYXP_TOKEN_PAR1,1);
        if (iVar3 != 0) {
          return -1;
        }
        uVar2 = *exp_idx;
        *exp_idx = uVar2 + 1;
        iVar3 = exp_check_token(ctx,exp,uVar2 + 1,LYXP_TOKEN_PAR2,1);
        if (iVar3 != 0) {
          return -1;
        }
      }
      *exp_idx = *exp_idx + 1;
      while ((*exp_idx < exp->used && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1))) {
        iVar3 = reparse_predicate(ctx,exp,exp_idx);
        if (iVar3 != 0) {
          return -1;
        }
      }
LAB_00179beb:
      uVar1 = *exp_idx;
      if (exp->used <= uVar1) {
        return 0;
      }
      if (exp->tokens[uVar1] != LYXP_TOKEN_OPERATOR_PATH) {
        return 0;
      }
      *exp_idx = uVar1 + 1;
    } while (exp->used != (uint16_t)(uVar1 + 1));
  }
LAB_00179ba0:
  ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
  return -1;
}

Assistant:

static int
reparse_relative_location_path(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    goto step;
    do {
        /* '/' or '//' */
        ++(*exp_idx);

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
            return -1;
        }
step:
        /* Step */
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            ++(*exp_idx);

            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
                return -1;
            }
            if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) && (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
                LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                       print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
                return -1;
            }
            /* fall through */
        case LYXP_TOKEN_NAMETEST:
            ++(*exp_idx);
            goto reparse_predicate;
            break;

        case LYXP_TOKEN_NODETYPE:
            ++(*exp_idx);

            /* '(' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR1, 1)) {
                return -1;
            }
            ++(*exp_idx);

            /* ')' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
                return -1;
            }
            ++(*exp_idx);

reparse_predicate:
            /* Predicate* */
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                if (reparse_predicate(ctx, exp, exp_idx)) {
                    return -1;
                }
            }
            break;
        default:
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}